

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_length_parameterized_bezier.cpp
# Opt level: O2

int main(void)

{
  void *pvVar1;
  Matrix<double,_2,_1,_0,_2,_1> *p;
  Mat *pMVar2;
  double t;
  _InputArray local_280;
  PointType ps4;
  PointType ps4_1;
  double local_228;
  double dStack_220;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  double local_1f0;
  double local_1e8;
  double dStack_1e0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  Mat img;
  Bezier<3,_2> bezier;
  
  ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (double)&img;
  _img = 0x4059000000000000;
  ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       1.97626258336499e-323;
  Bezier<3,_2>::Bezier(&bezier,(initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&ps4);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&ps4,0.0);
  cv::Mat::Mat(&img,500,700,0x10,(Scalar_ *)&ps4);
  ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       (double)&vec;
  vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (t = 0.0; t <= 1.0; t = t + 0.01) {
    local_280.flags = 0;
    ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0].
    _0_4_ = 4;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)&ps4,(double *)&bezier,(int *)&t,&local_280.flags,(double *)&ps4_1);
    local_280.flags =
         (int)ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array[0];
    ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0].
    _0_4_ = (int)ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                 array[1];
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
               ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
               array[1],&local_280.flags,(int *)&ps4_1);
  }
  local_280.sz.width = 0;
  local_280.sz.height = 0;
  local_280.flags = 0x3010000;
  local_280.obj = &img;
  ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]._0_4_
       = 0x8103000c;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ps4);
  ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = 0.0;
  ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 0.0;
  cv::polylines((_InputOutputArray *)&local_280,(_InputArray *)&ps4_1,false,(Scalar_ *)&ps4,1,0x10,0
               );
  t = 0.0;
  local_1f0 = 0.25;
  local_1e8 = 0.0;
  dStack_1e0 = 255.0;
  local_228 = 0.0;
  dStack_220 = 0.0;
  do {
    if (1.0 < t) {
      ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           (double)CONCAT44(ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                            m_storage.m_data.array[0]._4_4_,4);
      Curve<3,_2>::sampleWithArcLengthParameterized
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_280,&bezier.super_Curve<3,_2>,&local_1f0,false,(int *)&ps4,
                 (vector<double,_std::allocator<double>_> *)0x0);
      pvVar1 = local_280.obj;
      for (pMVar2 = (Mat *)CONCAT44(local_280._4_4_,local_280.flags); pMVar2 != (Mat *)pvVar1;
          pMVar2 = pMVar2 + 0x10) {
        ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
        ._0_4_ = 0x3010000;
        ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
             = (double)&img;
        local_210 = CONCAT44((int)*(double *)(pMVar2 + 8),(int)*(double *)pMVar2);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ps4);
        ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
             255.0;
        ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
             0.0;
        cv::circle(&ps4_1,&local_210,2,(Matx<double,_4,_1> *)&ps4,0xffffffff,8,0);
      }
      std::
      _Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                       *)&local_280);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ps4,"arc-length parameterized of bezier curve",(allocator<char> *)&ps4_1
                );
      local_280.sz.width = 0;
      local_280.sz.height = 0;
      local_280.flags = 0x1010000;
      local_280.obj = &img;
      cv::imshow((string *)&ps4,&local_280);
      std::__cxx11::string::~string((string *)&ps4);
      cv::waitKey(0);
      std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                (&vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
      cv::Mat::~Mat(&img);
      return 0;
    }
    ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (double)((ulong)ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                         m_data.array[0]._4_4_ << 0x20);
    local_280.flags = 4;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)&ps4_1,(double *)&bezier,(int *)&t,(int *)&ps4,(double *)&local_280);
    local_280.sz.width = 0;
    local_280.sz.height = 0;
    local_280.flags = 0x3010000;
    local_280.obj = &img;
    local_1f8 = CONCAT44((int)ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                              m_storage.m_data.array[1],
                         (int)(double)CONCAT44(ps4_1.
                                               super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                                               .m_storage.m_data.array[0]._4_4_,
                                               ps4_1.
                                               super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                                               .m_storage.m_data.array[0]._0_4_));
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ps4);
    ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         local_1e8;
    ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         dStack_1e0;
    cv::circle(&local_280,&local_1f8,4,(Matx<double,_4,_1> *)&ps4,0xffffffff,8,0);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    if (local_228 ==
        ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1])
    {
      if ((dStack_220 !=
           ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
           [1]) || (NAN(dStack_220) ||
                    NAN(ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                        m_data.array[1]))) goto LAB_00102647;
    }
    else {
LAB_00102647:
      local_280.sz.width = 0;
      local_280.sz.height = 0;
      local_280.flags = 0x3010000;
      local_280.obj = &img;
      local_200 = CONCAT44((int)dStack_220,(int)local_228);
      local_208 = CONCAT44((int)ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                m_storage.m_data.array[1],
                           (int)(double)CONCAT44(ps4_1.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                                                 .m_storage.m_data.array[0]._4_4_,
                                                 ps4_1.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                                                 .m_storage.m_data.array[0]._0_4_));
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ps4);
      ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           255.0;
      ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
           255.0;
      cv::line(&local_280,&local_200,&local_208,(Matx<double,_4,_1> *)&ps4,1,0x10,0);
    }
    local_228 = (double)CONCAT44(ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array[0]._4_4_,
                                 ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array[0]._0_4_);
    dStack_220 = ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                 .array[1];
    t = t + 0.25;
  } while( true );
}

Assistant:

int main() {
  // define a bezier
  Bezier bezier{{100, 200}, {400, 100}, {320, 300}, {600, 400}};

  Mat img(500, 700, CV_8UC3, Scalar(0));

  Eigen::Vector2d prev_point{0, 0};
  vector<Point> vec;

  // draw curve
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    vec.emplace_back(int(ps4[0]), int(ps4[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);

  // draw equal arc distance point
  t = 0, step = 0.25;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    circle(img, {int(ps4[0]), int(ps4[1])}, 4, {0, 255, 0}, -1);
    if (prev_point != Eigen::Vector2d::Zero()) {
      line(img,
           {int(prev_point[0]), int(prev_point[1])},
           {int(ps4[0]), int(ps4[1])},
           {255, 255, 255},
           1,
           LINE_AA);
    }
    prev_point = ps4;
    t += step;
  }

  for (auto& p : bezier.sampleWithArcLengthParameterized(step, false, 4)) {
    circle(img, {int(p[0]), int(p[1])}, 2, {255, 0, 0}, -1);
  }

  imshow("arc-length parameterized of bezier curve", img);
  waitKey(0);

  return 0;
}